

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O0

int equal_nocase(uchar *pattern,size_t pattern_len,uchar *subject,size_t subject_len,uint flags)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uchar r;
  uchar l;
  uint flags_local;
  size_t subject_len_local;
  uchar *subject_local;
  size_t pattern_len_local;
  uchar *pattern_local;
  
  subject_len_local = (size_t)subject;
  subject_local = (uchar *)pattern_len;
  pattern_len_local = (size_t)pattern;
  if (pattern_len == subject_len) {
    for (; subject_local != (uchar *)0x0; subject_local = subject_local + -1) {
      bVar1 = *(byte *)pattern_len_local;
      bVar2 = *(byte *)subject_len_local;
      if (bVar1 == 0) {
        return 0;
      }
      if (bVar1 != bVar2) {
        iVar3 = OPENSSL_tolower((uint)bVar1);
        iVar4 = OPENSSL_tolower((uint)bVar2);
        if (iVar3 != iVar4) {
          return 0;
        }
      }
      pattern_len_local = pattern_len_local + 1;
      subject_len_local = subject_len_local + 1;
    }
    pattern_local._4_4_ = 1;
  }
  else {
    pattern_local._4_4_ = 0;
  }
  return pattern_local._4_4_;
}

Assistant:

static int equal_nocase(const unsigned char *pattern, size_t pattern_len,
                        const unsigned char *subject, size_t subject_len,
                        unsigned int flags) {
  if (pattern_len != subject_len) {
    return 0;
  }
  while (pattern_len) {
    unsigned char l = *pattern;
    unsigned char r = *subject;
    // The pattern must not contain NUL characters.
    if (l == 0) {
      return 0;
    }
    if (l != r) {
      if (OPENSSL_tolower(l) != OPENSSL_tolower(r)) {
        return 0;
      }
    }
    ++pattern;
    ++subject;
    --pattern_len;
  }
  return 1;
}